

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_reporting.cc
# Opt level: O1

void gflags::ShowUsageWithFlagsMatching
               (char *argv0,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *substrings)

{
  string *psVar1;
  FILE *pFVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  CommandLineFlagInfo *extraout_RDX;
  CommandLineFlagInfo *extraout_RDX_00;
  CommandLineFlagInfo *flag;
  char *pcVar7;
  string *filename;
  bool bVar8;
  vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> flags;
  string last_filename;
  string local_a8;
  vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> local_88;
  undefined1 *local_70;
  CommandLineFlagInfo *local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  pFVar2 = _stdout;
  pcVar6 = strrchr(argv0,0x2f);
  pcVar7 = pcVar6 + 1;
  if (pcVar6 == (char *)0x0) {
    pcVar7 = argv0;
  }
  pcVar6 = ProgramUsage();
  fprintf(pFVar2,"%s: %s\n",pcVar7,pcVar6);
  local_88.
  super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetAllFlags(&local_88);
  local_70 = local_60;
  local_68 = (CommandLineFlagInfo *)0x0;
  local_60[0] = 0;
  if (local_88.
      super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_88.
      super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    bVar3 = true;
    bVar8 = false;
    filename = &(local_88.
                 super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start)->filename;
    do {
      if (((substrings->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start ==
           (substrings->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish) ||
         (bVar4 = FileMatchesSubstring(filename,substrings), bVar4)) {
        iVar5 = std::__cxx11::string::compare((char *)(filename + -3));
        bVar8 = true;
        if (iVar5 != 0) {
          flag = (CommandLineFlagInfo *)filename->_M_string_length;
          if ((flag != local_68) ||
             ((flag != (CommandLineFlagInfo *)0x0 &&
              (iVar5 = bcmp((filename->_M_dataplus)._M_p,local_70,(size_t)flag), flag = extraout_RDX
              , iVar5 != 0)))) {
            std::__cxx11::string::rfind((char)filename,0x2f);
            std::__cxx11::string::substr((ulong)&local_a8,(ulong)filename);
            std::__cxx11::string::rfind((char)(string *)&local_70,0x2f);
            std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_70);
            bVar4 = true;
            if (local_a8._M_string_length == local_48) {
              if (local_a8._M_string_length == 0) {
                bVar4 = false;
              }
              else {
                iVar5 = bcmp(local_a8._M_dataplus._M_p,local_50,local_a8._M_string_length);
                bVar4 = iVar5 != 0;
              }
            }
            if (local_50 != local_40) {
              operator_delete(local_50);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p);
            }
            if (bVar4) {
              if (!bVar3) {
                fwrite("\n\n",2,1,_stdout);
              }
              bVar3 = false;
            }
            fprintf(_stdout,"\n  Flags from %s:\n",(filename->_M_dataplus)._M_p);
            std::__cxx11::string::_M_assign((string *)&local_70);
            flag = extraout_RDX_00;
          }
          pFVar2 = _stdout;
          DescribeOneFlag_abi_cxx11_(&local_a8,(gflags *)(filename + -5),flag);
          fputs(local_a8._M_dataplus._M_p,pFVar2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p);
          }
        }
      }
      psVar1 = filename + 1;
      filename = (string *)&filename[6].field_2;
    } while ((pointer)&psVar1->field_2 !=
             local_88.
             super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    if (bVar8) goto LAB_001370bd;
  }
  if ((substrings->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (substrings->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    fwrite("\n  No modules matched: use -help\n",0x21,1,_stdout);
  }
LAB_001370bd:
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>::~vector
            (&local_88);
  return;
}

Assistant:

static void ShowUsageWithFlagsMatching(const char *argv0,
                                       const vector<string> &substrings) {
  fprintf(stdout, "%s: %s\n", Basename(argv0), ProgramUsage());

  vector<CommandLineFlagInfo> flags;
  GetAllFlags(&flags);           // flags are sorted by filename, then flagname

  string last_filename;          // so we know when we're at a new file
  bool first_directory = true;   // controls blank lines between dirs
  bool found_match = false;      // stays false iff no dir matches restrict
  for (vector<CommandLineFlagInfo>::const_iterator flag = flags.begin();
       flag != flags.end();
       ++flag) {
    if (substrings.empty() ||
        FileMatchesSubstring(flag->filename, substrings)) {
      found_match = true;     // this flag passed the match!
      // If the flag has been stripped, pretend that it doesn't exist.
      if (flag->description == kStrippedFlagHelp) continue;
      if (flag->filename != last_filename) {                      // new file
        if (Dirname(flag->filename) != Dirname(last_filename)) {  // new dir!
          if (!first_directory)
            fprintf(stdout, "\n\n");   // put blank lines between directories
          first_directory = false;
        }
        fprintf(stdout, "\n  Flags from %s:\n", flag->filename.c_str());
        last_filename = flag->filename;
      }
      // Now print this flag
      fprintf(stdout, "%s", DescribeOneFlag(*flag).c_str());
    }
  }
  if (!found_match && !substrings.empty()) {
    fprintf(stdout, "\n  No modules matched: use -help\n");
  }
}